

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void Hc4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  CLzRef CVar1;
  CLzRef CVar2;
  byte *pbVar3;
  CLzRef *pCVar4;
  UInt32 UVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  do {
    if (p->lenLimit < 4) {
      MatchFinder_MovePos(p);
    }
    else {
      pbVar3 = p->buffer;
      uVar6 = (uint)pbVar3[1] ^ p->crc[*pbVar3];
      uVar7 = (uint)pbVar3[2] << 8 ^ uVar6;
      pCVar4 = p->hash;
      uVar8 = ((p->crc[pbVar3[3]] << 5 ^ uVar7) & p->hashMask) + 0x10400;
      CVar1 = pCVar4[uVar8];
      CVar2 = p->pos;
      pCVar4[uVar8] = CVar2;
      pCVar4[(ulong)(uVar7 & 0xffff) + 0x400] = CVar2;
      pCVar4[uVar6 & 0x3ff] = CVar2;
      p->son[p->cyclicBufferPos] = CVar1;
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = pbVar3 + 1;
      UVar5 = p->pos + 1;
      p->pos = UVar5;
      if (UVar5 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Hc4_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2, h3;
    UInt32 *hash;
    SKIP_HEADER(4)
    HASH4_CALC;
    hash = p->hash;
    curMatch = hash[kFix4HashSize + hv];
    hash[                h2] =
    hash[kFix3HashSize + h3] =
    hash[kFix4HashSize + hv] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  }
  while (--num != 0);
}